

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_mark.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  double *pdVar7;
  long lVar8;
  uint uVar9;
  vector<double,_std::allocator<double>_> *f0_00;
  uint write_size;
  string *this;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  char *__s;
  double dVar17;
  int tmp;
  double upper_f0;
  double lower_f0;
  double sampling_rate;
  Polarity polarity;
  vector<double,_std::allocator<double>_> waveform;
  PitchExtraction pitch_extraction;
  vector<double,_std::allocator<double>_> pitch_mark;
  double unvoiced_value;
  double voicing_threshold;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> f0;
  ifstream ifs;
  string local_498;
  double local_478;
  double local_470;
  double local_468;
  ulong local_460;
  double local_458;
  uint local_450;
  Polarity local_44c;
  vector<double,_std::allocator<double>_> local_448;
  PitchExtraction local_428;
  vector<double,_std::allocator<double>_> local_418;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  string local_3e0 [3];
  ios_base local_370 [264];
  vector<double,_std::allocator<double>_> local_268;
  ulong local_250;
  ulong local_248;
  double local_240;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_458 = 16.0;
  local_468 = 60.0;
  local_470 = 240.0;
  local_3e8 = 0.9;
  local_3f0 = 0.0;
  local_460 = 0;
LAB_00104fbb:
  iVar4 = ya_getopt_long(argc,argv,"s:L:H:t:o:u:h",(option *)0x0,(int *)0x0);
  if (0x67 < iVar4) {
    switch(iVar4) {
    case 0x6f:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_498);
      if (bVar2) {
        bVar2 = sptk::IsInRange((int)local_498._M_dataplus._M_p,0,5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar2) {
          local_460 = (ulong)local_498._M_dataplus._M_p & 0xffffffff;
          break;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the range of ",0x10);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
      std::ostream::operator<<((ostream *)poVar5,5);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
      goto LAB_001056a3;
    case 0x73:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
      bVar2 = sptk::ConvertStringToDouble(&local_238,&local_458);
      if (!bVar2 || local_458 <= 6.0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
      }
      else {
        dVar17 = local_458;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          local_478 = local_458;
          operator_delete(local_238._M_dataplus._M_p);
          dVar17 = local_478;
        }
        if (dVar17 <= 98.0) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -s option must be a number ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the interval (",0x11);
      poVar5 = std::ostream::_M_insert<double>(6.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::ostream::_M_insert<double>(98.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
      goto LAB_001056a3;
    case 0x74:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
      bVar2 = sptk::ConvertStringToDouble(&local_238,&local_3e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -t option must be numeric",0x2e);
        local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
        sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
        goto LAB_001056a3;
      }
      break;
    case 0x75:
      goto switchD_00104fe9_caseD_75;
    default:
      if (iVar4 == 0x68) {
        anon_unknown.dwarf_2fd9::PrintUsage((ostream *)&std::cout);
        return 0;
      }
    case 0x70:
    case 0x71:
    case 0x72:
switchD_00104fe9_caseD_70:
      anon_unknown.dwarf_2fd9::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    goto LAB_00104fbb;
  }
  if (iVar4 == 0x48) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
    bVar1 = sptk::ConvertStringToDouble(&local_238,&local_470);
    bVar2 = local_470 <= 0.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -H option must be a positive number",
                 0x38);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
      goto LAB_001056a3;
    }
    goto LAB_00104fbb;
  }
  if (iVar4 == 0x4c) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
    bVar1 = sptk::ConvertStringToDouble(&local_238,&local_468);
    bVar2 = local_468 <= 10.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -L option must be a number ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"greater than 10",0xf);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
      goto LAB_001056a3;
    }
    goto LAB_00104fbb;
  }
  if (iVar4 != -1) goto switchD_00104fe9_caseD_70;
  if (local_458 * 1000.0 * 0.5 <= local_470) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,
               "Upper fundamental frequency must be less than Nyquist frequency",0x3f);
    local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
    goto LAB_001056a3;
  }
  if (local_470 <= local_468) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Lower fundamental frequency must be less than upper one",0x37)
    ;
    local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
    goto LAB_001056a3;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
    goto LAB_001056a3;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  local_478 = local_458 * 1000.0;
  bVar2 = sptk::SetBinaryMode();
  this = &local_238;
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
    goto LAB_001056a3;
  }
  std::ifstream::ifstream(this);
  if ((__s != (char *)0x0) &&
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3e0,"Cannot open file ",0x11);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0,__s,sVar6);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
    sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    std::ios_base::~ios_base(local_370);
    iVar4 = 1;
    goto LAB_00105d4b;
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    this = (string *)&std::cin;
  }
  sptk::PitchExtraction::PitchExtraction
            (&local_428,1,local_478,local_468,local_470,local_3e8,kReaper);
  if ((local_428.pitch_extraction_ == (PitchExtractionInterface *)0x0) ||
     (iVar4 = (*(local_428.pitch_extraction_)->_vptr_PitchExtractionInterface[2])(),
     (char)iVar4 == '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3e0,"Failed to initialize PitchExtraction",0x24);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
    sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    std::ios_base::~ios_base(local_370);
    iVar4 = 1;
    goto LAB_00105d2f;
  }
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  while (bVar2 = sptk::ReadStream<double>((double *)local_3e0,(istream *)this), bVar2) {
    if (local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_448,
                 (iterator)
                 local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)local_3e0);
    }
    else {
      *local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_3e0[0]._M_dataplus._M_p;
      local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  if (local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar4 = 0;
    goto LAB_00105d25;
  }
  uVar15 = (uint)local_460;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  f0_00 = &local_268;
  if (uVar15 == 2) {
    f0_00 = (vector<double,_std::allocator<double>_> *)0x0;
  }
  if (uVar15 < 2) {
    f0_00 = (vector<double,_std::allocator<double>_> *)0x0;
  }
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  bVar2 = sptk::PitchExtraction::Run(&local_428,&local_448,f0_00,&local_418,&local_44c);
  if (bVar2) {
    pdVar7 = local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar15 != 1) {
      for (; pdVar7 != local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
        *pdVar7 = *pdVar7 * local_478;
      }
    }
    if (local_44c == kUnknown) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3e0,"Failed to detect polarity",0x19);
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
      sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
      goto LAB_00105cc7;
    }
    local_3f8 = *(double *)(&DAT_0012a070 + (ulong)(local_44c == kPositive) * 8);
    uVar9 = uVar15 - 3;
    write_size = (uint)((ulong)((long)local_418.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_418.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
    iVar11 = (int)((ulong)((long)local_448.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_448.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (uVar9 < 3) {
      local_450 = uVar9;
      if ((int)write_size < 0) {
LAB_00106079:
        iVar4 = 0;
        goto LAB_00105cfc;
      }
      local_250 = (ulong)(write_size & 0x7fffffff);
      uVar14 = 0;
      iVar16 = 0;
      do {
        iVar10 = iVar11;
        if (uVar14 < local_250) {
          dVar17 = round(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14]);
          iVar10 = (int)dVar17;
        }
        iVar4 = iVar16;
        if (iVar16 < iVar10) {
          pdVar7 = local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar16;
          iVar12 = iVar16;
          do {
            if ((*pdVar7 == 0.0) && (iVar4 = iVar12, !NAN(*pdVar7))) break;
            iVar12 = iVar12 + 1;
            pdVar7 = pdVar7 + 1;
            iVar4 = iVar10;
          } while (iVar10 != iVar12);
        }
        local_248 = uVar14;
        if (iVar16 < iVar4) {
          lVar13 = (long)iVar16;
          lVar8 = lVar13 * 8;
          dVar17 = 0.0;
          do {
            dVar17 = dVar17 + *(double *)
                               ((long)local_268.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar8);
            lVar8 = lVar8 + 8;
          } while ((long)iVar4 * 8 - lVar8 != 0);
          if (local_450 < 3) {
            local_240 = 6.283185307179586 / dVar17;
            dVar17 = 0.0;
            do {
              local_478 = dVar17;
              if ((int)local_460 == 4) {
                dVar17 = cos(dVar17);
              }
              else if ((int)local_460 == 3) {
                dVar17 = sin(dVar17);
              }
              else {
                dVar17 = fmod(dVar17,6.283185307179586);
                dVar17 = dVar17 / 3.141592653589793 + -1.0;
              }
              bVar2 = sptk::WriteStream<double>(dVar17 * local_3f8,(ostream *)&std::cout);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3e0,"Failed to write periodic sequence",0x21);
                local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_498,"pitch_mark","");
                sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
                goto LAB_00105cc7;
              }
              dVar17 = local_478 +
                       local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13] * local_240;
              lVar13 = lVar13 + 1;
            } while (iVar4 != lVar13);
            goto LAB_00105ed0;
          }
          goto LAB_00105cf6;
        }
LAB_00105ed0:
        iVar16 = iVar10 - iVar4;
        if (iVar16 != 0 && iVar4 <= iVar10) {
          do {
            bVar2 = sptk::WriteStream<double>(local_3f0,(ostream *)&std::cout);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3e0,"Failed to write periodic sequence",0x21);
              local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
              sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
              goto LAB_00105cc7;
            }
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
        uVar14 = local_248 + 1;
        iVar4 = 0;
        iVar16 = iVar10;
        if (uVar14 == write_size + 1) goto LAB_00105cfc;
      } while( true );
    }
    if (uVar15 - 1 < 2) {
      if ((int)write_size < 1) goto LAB_00106079;
      iVar4 = 0;
      bVar2 = sptk::WriteStream<double>(0,write_size,&local_418,(ostream *)&std::cout,(int *)0x0);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3e0,"Failed to write pitch mark",0x1a);
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
        sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
        goto LAB_00105cc7;
      }
    }
    else {
      iVar4 = 1;
      if (uVar15 == 0) {
        if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar16 = -1;
        }
        else {
          dVar17 = round(*local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
          iVar16 = (int)dVar17;
        }
        if (iVar11 < 1) goto LAB_00106079;
        iVar10 = 0;
        iVar12 = 1;
        while (iVar10 != iVar16) {
          bVar2 = sptk::WriteStream<double>(0.0,(ostream *)&std::cout);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3e0,"Failed to write pitch mark",0x1a);
            local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
            sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
            goto LAB_00105cc7;
          }
LAB_0010606a:
          iVar10 = iVar10 + 1;
          iVar4 = 0;
          if (iVar11 == iVar10) goto LAB_00105cfc;
        }
        bVar2 = sptk::WriteStream<double>(local_3f8,(ostream *)&std::cout);
        if (bVar2) {
          iVar16 = iVar10;
          if (iVar12 < (int)write_size) {
            lVar8 = (long)iVar12;
            iVar12 = iVar12 + 1;
            dVar17 = round(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8]);
            iVar16 = (int)dVar17;
          }
          goto LAB_0010606a;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3e0,"Failed to write pitch mark",0x1a);
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
        sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
        goto LAB_00105cc7;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3e0,"Failed to extract pitch mark",0x1c);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"pitch_mark","");
    sptk::PrintErrorMessage(&local_498,(ostringstream *)local_3e0);
LAB_00105cc7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    std::ios_base::~ios_base(local_370);
LAB_00105cf6:
    iVar4 = 1;
  }
LAB_00105cfc:
  if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00105d25:
  if (local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_448.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00105d2f:
  local_428._vptr_PitchExtraction = (_func_int **)&PTR__PitchExtraction_00135a30;
  if (local_428.pitch_extraction_ != (PitchExtractionInterface *)0x0) {
    (*(local_428.pitch_extraction_)->_vptr_PitchExtractionInterface[1])();
  }
LAB_00105d4b:
  std::ifstream::~ifstream(&local_238);
  return iVar4;
switchD_00104fe9_caseD_75:
  std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
  bVar2 = sptk::ConvertStringToDouble(&local_238,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"The argument for the -u option must be a number",0x2f);
    local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
LAB_001056a3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
      operator_delete(local_3e0[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    return 1;
  }
  goto LAB_00104fbb;
}

Assistant:

int main(int argc, char* argv[]) {
  double sampling_rate(kDefaultSamplingRate);
  double lower_f0(kDefaultLowerF0);
  double upper_f0(kDefaultUpperF0);
  double voicing_threshold(kDefaultVoicingThreshold);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "s:L:H:t:o:u:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        const double min(6.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= min || max < sampling_rate) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a number "
                        << "in the interval (" << min << ", " << max << "]";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_f0) ||
            lower_f0 <= 10.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a number "
                        << "greater than 10";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_f0) ||
            upper_f0 <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToDouble(optarg, &voicing_threshold)) {
          std::ostringstream error_message;
          error_message << "The argument for the -t option must be numeric";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (0.5 * sampling_rate_in_hz <= upper_f0) {
    std::ostringstream error_message;
    error_message
        << "Upper fundamental frequency must be less than Nyquist frequency";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (upper_f0 <= lower_f0) {
    std::ostringstream error_message;
    error_message << "Lower fundamental frequency must be less than upper one";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch_mark", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::PitchExtraction pitch_extraction(
      1, sampling_rate_in_hz, lower_f0, upper_f0, voicing_threshold,
      sptk::PitchExtraction::Algorithms::kReaper);
  if (!pitch_extraction.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PitchExtraction";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::vector<double> waveform;
  {
    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      waveform.push_back(tmp);
    }
  }
  if (waveform.empty()) return 0;

  const bool waveform_output(kBinarySequence != output_format &&
                             kPositionInSeconds != output_format &&
                             kPositionInSamples != output_format);
  std::vector<double> f0;
  std::vector<double> pitch_mark;
  sptk::PitchExtractionInterface::Polarity polarity;
  if (!pitch_extraction.Run(waveform, waveform_output ? &f0 : NULL, &pitch_mark,
                            &polarity)) {
    std::ostringstream error_message;
    error_message << "Failed to extract pitch mark";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (kPositionInSeconds != output_format) {
    std::transform(
        pitch_mark.begin(), pitch_mark.end(), pitch_mark.begin(),
        [sampling_rate_in_hz](double x) { return x * sampling_rate_in_hz; });
  }

  if (sptk::PitchExtractionInterface::Polarity::kUnknown == polarity) {
    std::ostringstream error_message;
    error_message << "Failed to detect polarity";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const double binary_polarity(
      sptk::PitchExtractionInterface::Polarity::kPositive == polarity ? 1.0
                                                                      : -1.0);
  const int waveform_length(static_cast<int>(waveform.size()));
  const int num_pitch_marks(static_cast<int>(pitch_mark.size()));

  switch (output_format) {
    case kBinarySequence: {
      int next_pitch_mark(pitch_mark.empty()
                              ? -1
                              : static_cast<int>(std::round(pitch_mark[0])));
      for (int i(0), j(1); i < waveform_length; ++i) {
        if (i == next_pitch_mark) {
          if (!sptk::WriteStream(binary_polarity, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
          if (j < num_pitch_marks) {
            next_pitch_mark = static_cast<int>(std::round(pitch_mark[j++]));
          }
        } else {
          if (!sptk::WriteStream(0.0, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }
      }
      break;
    }
    case kPositionInSeconds:
    case kPositionInSamples: {
      if (0 < num_pitch_marks &&
          !sptk::WriteStream(0, num_pitch_marks, pitch_mark, &std::cout,
                             NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write pitch mark";
        sptk::PrintErrorMessage("pitch_mark", error_message);
        return 1;
      }
      break;
    }
    case kSine:
    case kCosine:
    case kSawtooth: {
      for (int n(0), i(0); n <= num_pitch_marks; ++n) {
        const int next_pitch_mark(
            n < num_pitch_marks ? static_cast<int>(std::round(pitch_mark[n]))
                                : waveform_length);
        // Find the point across voiced region to unvoiced one.
        int j(i);
        for (; j < next_pitch_mark; ++j) {
          if (0.0 == f0[j]) {
            break;
          }
        }

        // Output periodic sequence.
        if (i < j) {
          const double sum_f0(
              std::accumulate(f0.begin() + i, f0.begin() + j, 0.0));
          const double multiplier(sptk::kTwoPi / sum_f0);

          double phase(0.0);
          for (int k(i); k < j; ++k) {
            double value;
            switch (output_format) {
              case kSine: {
                value = std::sin(phase);
                break;
              }
              case kCosine: {
                value = std::cos(phase);
                break;
              }
              case kSawtooth: {
                value = std::fmod(phase, sptk::kTwoPi) / sptk::kPi - 1.0;
                break;
              }
              default: {
                return 1;
              }
            }
            if (!sptk::WriteStream(binary_polarity * value, &std::cout)) {
              std::ostringstream error_message;
              error_message << "Failed to write periodic sequence";
              sptk::PrintErrorMessage("pitch_mark", error_message);
              return 1;
            }
            phase += multiplier * f0[k];
          }
        }

        // Output unvoiced sequence.
        for (int k(j); k < next_pitch_mark; ++k) {
          if (!sptk::WriteStream(unvoiced_value, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write periodic sequence";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }

        i = next_pitch_mark;
      }
      break;
    }
    default: {
      return 1;
    }
  }

  return 0;
}